

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOArrayLengthCase::iterate(SSBOArrayLengthCase *this)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  allocator<char> local_689;
  string local_688;
  MessageBuilder local_668;
  int local_4e4;
  MessageBuilder local_4e0;
  undefined1 local_35a;
  allocator<char> local_359;
  string local_358;
  uint *local_338;
  void *ptr;
  int local_1b0 [4];
  MessageBuilder local_1a0;
  byte local_19;
  long lStack_18;
  bool error;
  Functions *gl;
  SSBOArrayLengthCase *this_local;
  
  gl = (Functions *)this;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar3);
  local_19 = 0;
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_1a0,(char (*) [37])"Allocating float memory buffer with ");
  local_1b0[0] = 0x10;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_1b0);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [11])" elements.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  (**(code **)(lStack_18 + 0x40))(0x90d2,this->m_targetBufferID);
  (**(code **)(lStack_18 + 0x150))(0x90d2,0x40,0,0x88ea);
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"update buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0xc0);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ptr,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&ptr,(char (*) [24])"Running compute shader.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ptr);
  pcVar1 = *(code **)(lStack_18 + 0x1680);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  (*pcVar1)(dVar4);
  (**(code **)(lStack_18 + 0x528))(1,1);
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0xc9);
  (**(code **)(lStack_18 + 0x40))(0x90d2,this->m_outputBufferID);
  local_338 = (uint *)(**(code **)(lStack_18 + 0xd00))(0x90d2,0,4,1);
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"map",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0xd1);
  if (local_338 == (uint *)0x0) {
    local_35a = 1;
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"mapBufferRange returned NULL",&local_359);
    tcu::TestError::TestError(pTVar8,&local_358);
    local_35a = 0;
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (*local_338 == 0x10) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_668,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_668,(char (*) [29])"Length returned was correct.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_668);
  }
  else {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4e0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_4e0,(char (*) [28])"ERROR: Length returned was ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_338);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0xf4afd9);
    local_4e4 = 0x10;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_4e4);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4e0);
    local_19 = 1;
  }
  cVar2 = (**(code **)(lStack_18 + 0x1670))(0x90d2);
  if (cVar2 == '\0') {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_688,"unmapBuffer returned false",&local_689);
    tcu::TestError::TestError(pTVar8,&local_688);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"unmap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0xe1);
  if ((local_19 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  return STOP;
}

Assistant:

SSBOArrayLengthCase::IterateResult SSBOArrayLengthCase::iterate (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	bool					error	= false;

	// Update buffer size

	m_testCtx.getLog() << tcu::TestLog::Message << "Allocating float memory buffer with " << static_cast<int>(s_fixedBufferSize) << " elements." << tcu::TestLog::EndMessage;

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_targetBufferID);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, s_fixedBufferSize * (int)sizeof(float), DE_NULL, GL_DYNAMIC_COPY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "update buffer");

	// Run compute

	m_testCtx.getLog() << tcu::TestLog::Message << "Running compute shader." << tcu::TestLog::EndMessage;

	gl.useProgram(m_shader->getProgram());
	gl.dispatchCompute(1, 1, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "dispatch");

	// Verify
	{
		const void* ptr;

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBufferID);
		ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (int)sizeof(deUint32), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "map");

		if (!ptr)
			throw tcu::TestError("mapBufferRange returned NULL");

		if (*(const deUint32*)ptr != (deUint32)s_fixedBufferSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Length returned was " << *(const deUint32*)ptr << ", expected " << static_cast<int>(s_fixedBufferSize) << tcu::TestLog::EndMessage;
			error = true;
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "Length returned was correct." << tcu::TestLog::EndMessage;

		if (gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER) == GL_FALSE)
			throw tcu::TestError("unmapBuffer returned false");

		GLU_EXPECT_NO_ERROR(gl.getError(), "unmap");
	}

	if (!error)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	return STOP;
}